

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void * threadsafe_mem_leak_operator_new(size_t size)

{
  char *pcVar1;
  undefined8 uVar2;
  void *memory;
  MemLeakScopedMutex lock;
  undefined1 in_stack_ffffffffffffffaf;
  bad_alloc *in_stack_ffffffffffffffb0;
  TestMemoryAllocator *in_stack_ffffffffffffffb8;
  MemoryLeakDetector *in_stack_ffffffffffffffc0;
  
  MemLeakScopedMutex::MemLeakScopedMutex((MemLeakScopedMutex *)in_stack_ffffffffffffffb0);
  MemoryLeakWarningPlugin::getGlobalDetector();
  getCurrentNewAllocator();
  pcVar1 = MemoryLeakDetector::allocMemory
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      (size_t)in_stack_ffffffffffffffb0,(bool)in_stack_ffffffffffffffaf);
  if (pcVar1 == (char *)0x0) {
    uVar2 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(in_stack_ffffffffffffffb0);
    __cxa_throw(uVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  MemLeakScopedMutex::~MemLeakScopedMutex((MemLeakScopedMutex *)0x172079);
  return pcVar1;
}

Assistant:

UT_THROW(std::bad_alloc)
{
    MemLeakScopedMutex lock;
    void* memory = MemoryLeakWarningPlugin::getGlobalDetector()->allocMemory(getCurrentNewAllocator(), size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}